

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_kem.c
# Opt level: O0

int rsakem_set_ctx_params(void *vprsactx,OSSL_PARAM *params)

{
  int iVar1;
  OSSL_PARAM *pOVar2;
  long in_RSI;
  long in_RDI;
  int op;
  OSSL_PARAM *p;
  PROV_RSA_CTX_conflict *prsactx;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = 0;
  }
  else if (in_RSI == 0) {
    local_4 = 1;
  }
  else {
    pOVar2 = OSSL_PARAM_locate_const
                       ((OSSL_PARAM *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffc8);
    if (pOVar2 != (OSSL_PARAM *)0x0) {
      if (pOVar2->data_type != 4) {
        return 0;
      }
      iVar1 = rsakem_opname2id((char *)0x32f84d);
      if (iVar1 < 0) {
        return 0;
      }
      *(int *)(in_RDI + 0x10) = iVar1;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int rsakem_set_ctx_params(void *vprsactx, const OSSL_PARAM params[])
{
    PROV_RSA_CTX *prsactx = (PROV_RSA_CTX *)vprsactx;
    const OSSL_PARAM *p;
    int op;

    if (prsactx == NULL)
        return 0;
    if (params == NULL)
        return 1;


    p = OSSL_PARAM_locate_const(params, OSSL_KEM_PARAM_OPERATION);
    if (p != NULL) {
        if (p->data_type != OSSL_PARAM_UTF8_STRING)
            return 0;
        op = rsakem_opname2id(p->data);
        if (op < 0)
            return 0;
        prsactx->op = op;
    }
    return 1;
}